

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void finalize(Mat *result,Mat *ocount)

{
  int local_34;
  float *pfStack_30;
  int x;
  float *p_count;
  float *p_res;
  int y;
  Mat *ocount_local;
  Mat *result_local;
  
  for (p_res._4_4_ = 0; p_res._4_4_ < *(int *)(result + 8); p_res._4_4_ = p_res._4_4_ + 1) {
    p_count = cv::Mat::ptr<float>(result,p_res._4_4_);
    pfStack_30 = cv::Mat::ptr<float>(ocount,p_res._4_4_);
    for (local_34 = 0; local_34 < *(int *)(result + 0xc); local_34 = local_34 + 1) {
      if (0.0 < *pfStack_30) {
        *p_count = *p_count / *pfStack_30;
      }
      p_count = p_count + 1;
      pfStack_30 = pfStack_30 + 1;
    }
  }
  return;
}

Assistant:

static
void finalize(cv::Mat &result, cv::Mat const &ocount)
{
#ifdef WITH_DISPATCH
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
  dispatch_apply(result.rows, queue,
                 ^(size_t y) {
                   float* p_res = result.ptr<float>(y);
                   float const* p_count = ocount.ptr<float>(y);
                   
                   for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
                     if ( *p_count > 0.0 )
                       *p_res /= *p_count;
                 });
#else
  for (int y = 0; y < result.rows; ++y)
  {
    float* p_res = result.ptr<float>(y);
    float const* p_count = ocount.ptr<float>(y);

    for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
      if ( *p_count > 0.0 )
        *p_res /= *p_count;
  }
#endif
}